

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O3

ll_ringbuffer_data_pair * __thiscall
RingBuffer::getReadVector(ll_ringbuffer_data_pair *__return_storage_ptr__,RingBuffer *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  anon_union_16_2_dde17770_for_FlexArray<al::byte,_16UL>_3 *paVar4;
  anon_union_16_2_dde17770_for_FlexArray<al::byte,_16UL>_3 *paVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  (__return_storage_ptr__->second).buf = (byte *)0x0;
  (__return_storage_ptr__->second).len = 0;
  (__return_storage_ptr__->first).buf = (byte *)0x0;
  (__return_storage_ptr__->first).len = 0;
  uVar3 = this->mSizeMask;
  uVar7 = (this->mReadPtr).super___atomic_base<unsigned_long>._M_i & uVar3;
  uVar6 = ((this->mWritePtr).super___atomic_base<unsigned_long>._M_i & uVar3) - uVar7 & uVar3;
  uVar2 = uVar6 + uVar7;
  uVar1 = uVar3 + 1;
  uVar8 = uVar1 - uVar7;
  if (uVar2 <= uVar1) {
    uVar8 = uVar6;
  }
  paVar5 = (anon_union_16_2_dde17770_for_FlexArray<al::byte,_16UL>_3 *)(uVar3 & uVar2);
  paVar4 = &(this->mBuffer).field_1;
  if (uVar2 <= uVar1) {
    paVar5 = (anon_union_16_2_dde17770_for_FlexArray<al::byte,_16UL>_3 *)0x0;
    paVar4 = (anon_union_16_2_dde17770_for_FlexArray<al::byte,_16UL>_3 *)0x0;
  }
  (__return_storage_ptr__->first).buf = (this->mBuffer).field_1.mArray + uVar7 * this->mElemSize;
  (__return_storage_ptr__->first).len = uVar8;
  (__return_storage_ptr__->second).buf = (byte *)paVar4;
  (__return_storage_ptr__->second).len = (size_t)paVar5;
  return __return_storage_ptr__;
}

Assistant:

ll_ringbuffer_data_pair RingBuffer::getReadVector() const noexcept
{
    ll_ringbuffer_data_pair ret;

    size_t w{mWritePtr.load(std::memory_order_acquire)};
    size_t r{mReadPtr.load(std::memory_order_acquire)};
    w &= mSizeMask;
    r &= mSizeMask;
    const size_t free_cnt{(w-r) & mSizeMask};

    const size_t cnt2{r + free_cnt};
    if(cnt2 > mSizeMask+1)
    {
        /* Two part vector: the rest of the buffer after the current read ptr,
         * plus some from the start of the buffer. */
        ret.first.buf = const_cast<al::byte*>(mBuffer.data() + r*mElemSize);
        ret.first.len = mSizeMask+1 - r;
        ret.second.buf = const_cast<al::byte*>(mBuffer.data());
        ret.second.len = cnt2 & mSizeMask;
    }
    else
    {
        /* Single part vector: just the rest of the buffer */
        ret.first.buf = const_cast<al::byte*>(mBuffer.data() + r*mElemSize);
        ret.first.len = free_cnt;
        ret.second.buf = nullptr;
        ret.second.len = 0;
    }

    return ret;
}